

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O2

void Abc_NtkOrderFaninsByLitCount(Abc_Ntk_t *pNtk)

{
  int *pArray;
  uint uVar1;
  int iVar2;
  Vec_Int_t *p;
  Vec_Str_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  int Fill;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    pcVar10 = "Abc_NtkHasSop(pNtk)";
    uVar1 = 100;
LAB_001c1699:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanOrder.c"
                  ,uVar1,"void Abc_NtkOrderFaninsByLitCount(Abc_Ntk_t *)");
  }
  p = Vec_IntAlloc((int)pNtk);
  iVar8 = 100;
  p_00 = Vec_StrAlloc(100);
  p_01 = Vec_IntAlloc(iVar8);
  p_02 = Vec_IntAlloc(iVar8);
  iVar8 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar8) {
      Vec_IntFree(p_02);
      Vec_IntFree(p_01);
      Vec_IntFree(p);
      Vec_StrFree(p_00);
      return;
    }
    pAVar3 = Abc_NtkObj(pNtk,iVar8);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
      pcVar10 = (char *)(pAVar3->field_5).pData;
      uVar1 = Abc_SopGetVarNum(pcVar10);
      if (uVar1 != (pAVar3->vFanins).nSize) {
        pcVar10 = "nVars == Abc_ObjFaninNum(pNode)";
        uVar1 = 0x6d;
        goto LAB_001c1699;
      }
      uVar11 = (ulong)uVar1;
      Vec_IntFill(p_01,uVar1,Fill);
      iVar2 = uVar1 + 3;
      uVar5 = extraout_RDX;
      pcVar6 = pcVar10;
      if ((int)uVar1 < 1) {
        uVar11 = 0;
      }
      for (; *pcVar6 != '\0'; pcVar6 = pcVar6 + iVar2) {
        for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
          if (pcVar6[uVar9] != '-') {
            Vec_IntAddToEntry(p_01,(int)uVar9,(int)uVar5);
            uVar5 = extraout_RDX_00;
          }
        }
      }
      p->nSize = 0;
      for (iVar7 = 0; (int)uVar11 != iVar7; iVar7 = iVar7 + 1) {
        Vec_IntPush(p,iVar7);
      }
      pArray = p->pArray;
      Vec_IntSelectSortCost(pArray,uVar1,p_01);
      iVar7 = Abc_SopGetCubeNum(pcVar10);
      Vec_StrGrow(p_00,iVar7 * iVar2 + 1);
      pcVar6 = p_00->pArray;
      iVar7 = Abc_SopGetCubeNum(pcVar10);
      memcpy(pcVar6,pcVar10,(long)(iVar7 * iVar2 + 1));
      pcVar4 = pcVar10;
      for (; *pcVar6 != '\0'; pcVar6 = pcVar6 + iVar2) {
        for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
          pcVar4[uVar9] = '-';
        }
        for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
          if ((pcVar6[pArray[uVar9]] & 0xfeU) == 0x30) {
            pcVar4[uVar9] = pcVar6[pArray[uVar9]];
          }
        }
        pcVar4 = pcVar4 + iVar2;
      }
      (pAVar3->field_5).pData = pcVar10;
      p_02->nSize = 0;
      for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        Vec_IntPush(p_02,(pAVar3->vFanins).pArray[pArray[uVar9]]);
      }
      (pAVar3->vFanins).nSize = 0;
      Vec_IntAppend(&pAVar3->vFanins,p_02);
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void Abc_NtkOrderFaninsByLitCount( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vOrder;
    Vec_Int_t * vCounts;
    Vec_Int_t * vFanins;
    Vec_Str_t * vStore;
    Abc_Obj_t * pNode;
    char * pSop, * pSopNew;
    char * pCube, * pCubeNew;
    int nVars, i, v, * pOrder;
    assert( Abc_NtkHasSop(pNtk) );
    vOrder = Vec_IntAlloc( 100 );
    vStore = Vec_StrAlloc( 100 );
    vCounts = Vec_IntAlloc( 100 );
    vFanins = Vec_IntAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        pSop = (char *)pNode->pData;
        nVars = Abc_SopGetVarNum(pSop);
        assert( nVars == Abc_ObjFaninNum(pNode) );
        // count literals
        Vec_IntFill( vCounts, nVars, 0 );
        Abc_SopForEachCube( pSop, nVars, pCube )
            for ( v = 0; v < nVars; v++ )
                if ( pCube[v] != '-' )
                    Vec_IntAddToEntry( vCounts, v, 1 );
        // find good order
        Vec_IntClear( vOrder );
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vOrder, v );
        pOrder = Vec_IntArray(vOrder);
        Vec_IntSelectSortCost( pOrder, nVars, vCounts );
        // copy the cover
        Vec_StrGrow( vStore, Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1 );
        memcpy( Vec_StrArray(vStore), pSop, Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1 );
        pSopNew = pCubeNew = pSop;
        pSop = Vec_StrArray(vStore);
        // generate permuted one
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            for ( v = 0; v < nVars; v++ )
                pCubeNew[v] = '-';
            for ( v = 0; v < nVars; v++ )
                if ( pCube[pOrder[v]] == '0' )
                    pCubeNew[v] = '0';
                else if ( pCube[pOrder[v]] == '1' )
                    pCubeNew[v] = '1';
            pCubeNew += nVars + 3;
        }
        pNode->pData = pSopNew;
        // generate the fanin order
        Vec_IntClear( vFanins );
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vFanins, Abc_ObjFaninId( pNode, pOrder[v] ) );
        Vec_IntClear( &pNode->vFanins );
        Vec_IntAppend( &pNode->vFanins, vFanins );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vCounts );
    Vec_IntFree( vOrder );
    Vec_StrFree( vStore );
}